

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

const_iterator __thiscall
duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>::Scan
          (ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> *this)

{
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  iterator i;
  iterator highest_frequency;
  unordered_map<duckdb::interval_t,_duckdb::ModeAttr,_std::hash<duckdb::interval_t>,_std::equal_to<duckdb::interval_t>,_std::allocator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_const_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>
  *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_true> local_28;
  _Node_iterator_base<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_true> local_20;
  _Node_iterator_base<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_true> local_18;
  _Node_iterator_base<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_true> local_8;
  
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<duckdb::interval_t,_duckdb::ModeAttr,_std::hash<duckdb::interval_t>,_std::equal_to<duckdb::interval_t>,_std::allocator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_18._M_cur = local_20._M_cur;
  do {
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<duckdb::interval_t,_duckdb::ModeAttr,_std::hash<duckdb::interval_t>,_std::equal_to<duckdb::interval_t>,_std::allocator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar2 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar2) {
      std::__detail::
      _Node_const_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>::
      _Node_const_iterator
                (in_stack_ffffffffffffffc0,
                 (_Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>
                  *)in_stack_ffffffffffffffb8);
      return (const_iterator)
             (_Node_iterator_base<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_true>)
             local_8._M_cur;
    }
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>
                         *)0xb30580);
    uVar1 = (ppVar3->second).count;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>
                         *)0xb30593);
    if ((ppVar3->second).count < uVar1) {
LAB_00b305f5:
      local_18._M_cur = local_20._M_cur;
    }
    else {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>
                           *)0xb305ab);
      in_stack_ffffffffffffffc0 =
           (_Node_const_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>
            *)(ppVar3->second).count;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>
                           *)0xb305be);
      if (in_stack_ffffffffffffffc0 ==
          (_Node_const_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>
           *)(ppVar3->second).count) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>
                               *)0xb305d6);
        in_stack_ffffffffffffffb8 =
             (unordered_map<duckdb::interval_t,_duckdb::ModeAttr,_std::hash<duckdb::interval_t>,_std::equal_to<duckdb::interval_t>,_std::allocator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>_>_>
              *)(ppVar3->second).first_row;
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>
                               *)0xb305e8);
        if (in_stack_ffffffffffffffb8 <
            (unordered_map<duckdb::interval_t,_duckdb::ModeAttr,_std::hash<duckdb::interval_t>,_std::equal_to<duckdb::interval_t>,_std::allocator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>_>_>
             *)(ppVar3->second).first_row) goto LAB_00b305f5;
      }
    }
    std::__detail::
    _Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true>::operator++
              ((_Node_iterator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_false,_true> *
               )in_stack_ffffffffffffffc0);
  } while( true );
}

Assistant:

typename Counts::const_iterator Scan() const {
		//! Initialize control variables to first variable of the frequency map
		auto highest_frequency = frequency_map->begin();
		for (auto i = highest_frequency; i != frequency_map->end(); ++i) {
			// Tie break with the lowest insert position
			if (i->second.count > highest_frequency->second.count ||
			    (i->second.count == highest_frequency->second.count &&
			     i->second.first_row < highest_frequency->second.first_row)) {
				highest_frequency = i;
			}
		}
		return highest_frequency;
	}